

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O1

int mixed_queue_clear(mixed_segment *segment)

{
  vector *vector;
  mixed_segment *segment_00;
  int iVar1;
  uint32_t uVar2;
  ulong uVar3;
  mixed_segment_info info;
  mixed_segment_info mStack_448;
  
  vector = (vector *)segment->data;
  memset(&mStack_448,0,0x420);
  if (vector->count != 0) {
    uVar3 = 0;
    do {
      segment_00 = (mixed_segment *)vector->data[uVar3];
      mixed_segment_end(segment_00);
      mixed_segment_info(&mStack_448,segment_00);
      if (mStack_448.max_inputs != 0) {
        uVar2 = 0;
        do {
          mixed_segment_set_in(0,uVar2,(void *)0x0,segment_00);
          uVar2 = uVar2 + 1;
        } while (uVar2 < mStack_448.max_inputs);
      }
      if (mStack_448.outputs != 0) {
        uVar2 = 0;
        do {
          mixed_segment_set_out(0,uVar2,(void *)0x0,segment_00);
          uVar2 = uVar2 + 1;
        } while (uVar2 < mStack_448.outputs);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < vector->count);
  }
  iVar1 = vector_clear(vector);
  return iVar1;
}

Assistant:

MIXED_EXPORT int mixed_queue_clear(struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  struct mixed_segment_info info = {0};
  
  for(uint32_t i=0; i<data->count; ++i){
    struct mixed_segment *old = data->queue[i];
    mixed_segment_end(old);
    mixed_segment_info(&info, old);
    for(uint32_t i=0; i<info.max_inputs; ++i){
      mixed_segment_set_in(MIXED_BUFFER, i, 0, old);
    }
    for(uint32_t i=0; i<info.outputs; ++i){
      mixed_segment_set_out(MIXED_BUFFER, i, 0, old);
    }
  }
  return vector_clear((struct vector *)data);
}